

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_solaris_pax_sparse.c
# Opt level: O1

void test_compat_solaris_pax_sparse(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *paVar4;
  char *pcVar5;
  time_t tVar6;
  la_int64_t lVar7;
  void *pvVar8;
  archive_entry *ae;
  size_t bytes_read;
  int64_t offset;
  void *buff;
  int64_t length;
  char name [39];
  char data [8192];
  size_t l;
  char *ld;
  archive_entry *local_2098;
  ulong local_2090;
  longlong local_2088;
  void *local_2080;
  archive_conflict *local_2078;
  longlong local_2070;
  char local_2068 [12];
  undefined4 uStack_205c;
  undefined3 local_2058;
  char acStack_2055 [13];
  undefined7 uStack_2048;
  undefined8 local_2038;
  char acStack_2030 [8192];
  
  local_2058 = 0x736972;
  builtin_strncpy(acStack_2055,"_pax_sparse_1",0xd);
  builtin_strncpy(local_2068,"test_compat_",0xc);
  uStack_205c = 0x616c6f73;
  uStack_2048 = 0x5a2e7861702e;
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                   ,L'*',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  extract_reference_file(local_2068);
  wVar2 = archive_read_open_filename(paVar4,local_2068,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'.',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_2098);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",paVar4
                     );
  if (iVar1 == 0) {
    pcVar5 = archive_entry_pathname(local_2098);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'6',"hole","\"hole\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar6 = archive_entry_mtime(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'7',0x4e1b4ba3,"1310411683",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
    lVar7 = archive_entry_uid(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'8',0x65,"101",lVar7,"archive_entry_uid(ae)",(void *)0x0);
    pcVar5 = archive_entry_uname(local_2098);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'9',"cue","\"cue\"",pcVar5,"archive_entry_uname(ae)",(void *)0x0,L'\0');
    lVar7 = archive_entry_gid(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L':',10,"10",lVar7,"archive_entry_gid(ae)",(void *)0x0);
    pcVar5 = archive_entry_gname(local_2098);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L';',"staff","\"staff\"",pcVar5,"archive_entry_gname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'<',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    failure("This sparse file should have three data blocks");
    wVar2 = archive_entry_sparse_reset(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'@',3,"3",(long)wVar2,"archive_entry_sparse_reset(ae)",(void *)0x0);
    wVar2 = archive_entry_sparse_next(local_2098,&local_2088,&local_2070);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'B',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'C',0,"0",local_2088,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'D',0x20000,"131072",local_2070,"length",(void *)0x0);
    wVar2 = archive_entry_sparse_next(local_2098,&local_2088,&local_2070);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'F',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'G',0x60000,"393216",local_2088,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'H',0x20000,"131072",local_2070,"length",(void *)0x0);
    wVar2 = archive_entry_sparse_next(local_2098,&local_2088,&local_2070);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'J',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'K',0xc0000,"786432",local_2088,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'L',0x8007,"32775",local_2070,"length",(void *)0x0);
    iVar1 = archive_read_data_block((archive *)paVar4,&local_2080,&local_2090,&local_2088);
    while (iVar1 == 0) {
      failure("The data blocks should not include the hole");
      if (((local_2088 < 0) || (wVar2 = L'\x01', 0x20000 < local_2090 + local_2088)) &&
         ((local_2088 < 0x60000 || (wVar2 = L'\x01', 0x80000 < local_2090 + local_2088)))) {
        wVar2 = (wchar_t)(local_2088 + local_2090 < 0xc8008 && 0xbffff < local_2088);
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                       ,L'R',wVar2,
                       "(offset >= 0 && offset + bytes_read <= 131072) || (offset >= 393216 && offset + bytes_read <= 393216+131072) || (offset >= 786432 && offset + bytes_read <= 786432+32775)"
                       ,(void *)0x0);
      if (local_2090 < 0x2000 || local_2088 != 0) {
        if (6 < local_2090 && local_2088 + local_2090 == 0xc8007) {
          pvVar8 = (void *)((long)local_2080 + (local_2090 - 7));
          local_2038 = CONCAT17(local_2038._7_1_,0x63636363636363);
          failure("Last seven bytes should be all \'c\'");
          ld = "7";
          l = 7;
          wVar2 = L'\\';
          pcVar5 = "last";
          goto LAB_001398d2;
        }
      }
      else {
        memset(&local_2038,0x61,0x2000);
        failure("First data block should be 8K bytes of \'a\'");
        ld = "sizeof(data)";
        l = 0x2000;
        wVar2 = L'V';
        pcVar5 = "buff";
        pvVar8 = local_2080;
LAB_001398d2:
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                            ,wVar2,pvVar8,pcVar5,&local_2038,"data",l,ld,(void *)0x0);
      }
      iVar1 = archive_read_data_block((archive *)paVar4,&local_2080,&local_2090,&local_2088);
    }
    iVar1 = archive_read_next_header((archive *)paVar4,&local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'a',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    iVar1 = archive_filter_code((archive *)paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'd',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                        (void *)0x0);
    iVar1 = archive_format((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'e',(long)iVar1,"archive_format(a)",0x30002,
                        "ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(void *)0x0);
    iVar1 = archive_read_close((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'h',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    archive_read_free((archive *)paVar4);
  }
  builtin_strncpy(acStack_2030,"pat_solaris_pax_sparse_2.pax.Z",0x1f);
  local_2038._0_1_ = 't';
  local_2038._1_1_ = 'e';
  local_2038._2_1_ = 's';
  local_2038._3_1_ = 't';
  local_2038._4_1_ = '_';
  local_2038._5_1_ = 'c';
  local_2038._6_1_ = 'o';
  local_2038._7_1_ = 'm';
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                   ,L'z',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  extract_reference_file((char *)&local_2038);
  wVar2 = archive_read_open_filename(paVar4,(char *)&local_2038,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'~',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_2098);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                      ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",
                      paVar4);
  if (iVar1 == 0) {
    pcVar5 = archive_entry_pathname(local_2098);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x86',"hole","\"hole\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar6 = archive_entry_mtime(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x87',0x4e1b5f95,"1310416789",tVar6,"archive_entry_mtime(ae)",(void *)0x0
                       );
    lVar7 = archive_entry_uid(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x88',0x65,"101",lVar7,"archive_entry_uid(ae)",(void *)0x0);
    pcVar5 = archive_entry_uname(local_2098);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x89',"cue","\"cue\"",pcVar5,"archive_entry_uname(ae)",(void *)0x0,L'\0');
    lVar7 = archive_entry_gid(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x8a',10,"10",lVar7,"archive_entry_gid(ae)",(void *)0x0);
    pcVar5 = archive_entry_gname(local_2098);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
               ,L'\x8b',"staff","\"staff\"",pcVar5,"archive_entry_gname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x8c',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0)
    ;
    failure("This sparse file should have two data blocks");
    wVar2 = archive_entry_sparse_reset(local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x90',2,"2",(long)wVar2,"archive_entry_sparse_reset(ae)",(void *)0x0);
    wVar2 = archive_entry_sparse_next(local_2098,&local_2088,&local_2070);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x92',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x93',0x60000,"393216",local_2088,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x94',0x20000,"131072",local_2070,"length",(void *)0x0);
    wVar2 = archive_entry_sparse_next(local_2098,&local_2088,&local_2070);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x96',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_entry_sparse_next(ae, &offset, &length)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x97',0xc0000,"786432",local_2088,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'\x98',0x801f,"32799",local_2070,"length",(void *)0x0);
    iVar1 = archive_read_data_block((archive *)paVar4,&local_2080,&local_2090,&local_2088);
    if (iVar1 == 0) {
      local_2078 = paVar4;
      do {
        failure("The data blocks should not include the hole");
        if ((local_2088 < 0x60000) || (wVar2 = L'\x01', 0x80000 < local_2090 + local_2088)) {
          wVar2 = (wchar_t)(local_2088 + local_2090 < 0xc8020 && 0xbffff < local_2088);
        }
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                         ,L'\x9d',wVar2,
                         "(offset >= 393216 && offset + bytes_read <= 393216+131072) || (offset >= 786432 && offset + bytes_read <= 786432+32799)"
                         ,(void *)0x0);
        if ((0x1e < local_2090) && (local_2088 + local_2090 == 0xc801f)) {
          pvVar8 = (void *)((long)local_2080 + (local_2090 - 0x1f));
          builtin_strncpy(local_2068,"cccccccccccc",0xc);
          uStack_205c = 0x63636363;
          local_2058 = 0x636363;
          builtin_strncpy(acStack_2055,"cccccccccccc",0xc);
          failure("Last 31 bytes should be all \'c\'");
          paVar4 = local_2078;
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                              ,L'¤',pvVar8,"last",local_2068,"data",0x1f,"31",(void *)0x0);
        }
        iVar1 = archive_read_data_block((archive *)paVar4,&local_2080,&local_2090,&local_2088);
      } while (iVar1 == 0);
    }
    iVar1 = archive_read_next_header((archive *)paVar4,&local_2098);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'©',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                       );
    iVar1 = archive_filter_code((archive *)paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'¬',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                        (void *)0x0);
    iVar1 = archive_format((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'­',(long)iVar1,"archive_format(a)",0x30002,
                        "ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(void *)0x0);
    iVar1 = archive_read_close((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_pax_sparse.c"
                        ,L'°',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    archive_read_free((archive *)paVar4);
  }
  return;
}

Assistant:

static void
test_compat_solaris_pax_sparse_1(void)
{
	char name[] = "test_compat_solaris_pax_sparse_1.pax.Z";
	struct archive_entry *ae;
	struct archive *a;
	int64_t offset, length;
	const void *buff;
	size_t bytes_read;
	char data[1024*8];
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, r = archive_read_next_header(a, &ae));
	if (r != ARCHIVE_OK) {
		archive_read_free(a);
		return;
	}
	assertEqualString("hole", archive_entry_pathname(ae));
	assertEqualInt(1310411683, archive_entry_mtime(ae));
	assertEqualInt(101, archive_entry_uid(ae));
	assertEqualString("cue", archive_entry_uname(ae));
	assertEqualInt(10, archive_entry_gid(ae));
	assertEqualString("staff", archive_entry_gname(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	/* Verify the sparse information. */
	failure("This sparse file should have three data blocks");
	assertEqualInt(3, archive_entry_sparse_reset(ae));
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(0, offset);
	assertEqualInt(131072, length);
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(393216, offset);
	assertEqualInt(131072, length);
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(786432, offset);
	assertEqualInt(32775, length);
	while (ARCHIVE_OK ==
	    archive_read_data_block(a, &buff, &bytes_read, &offset)) {
		failure("The data blocks should not include the hole");
		assert((offset >= 0 && offset + bytes_read <= 131072) ||
		       (offset >= 393216 && offset + bytes_read <= 393216+131072) ||
		       (offset >= 786432 && offset + bytes_read <= 786432+32775));
		if (offset == 0 && bytes_read >= 1024*8) {
			memset(data, 'a', sizeof(data));
			failure("First data block should be 8K bytes of 'a'");
			assertEqualMem(buff, data, sizeof(data));
		} else if (offset + bytes_read == 819207 && bytes_read >= 7) {
			const char *last = buff;
			last += bytes_read - 7;
			memset(data, 'c', 7);
			failure("Last seven bytes should be all 'c'");
			assertEqualMem(last, data, 7);
		}
	}

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}